

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_path.c
# Opt level: O0

int sys_open(char *path,int oflag,...)

{
  char in_AL;
  int iVar1;
  undefined8 in_RCX;
  ulong in_RDX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_4d8 [16];
  ulong local_4c8;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_498;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined4 local_428;
  undefined4 local_424;
  va_list ap;
  int imode;
  mode_t mode;
  char pathbuf [1000];
  int fd;
  int i;
  int oflag_local;
  char *path_local;
  
  if (in_AL != '\0') {
    local_4a8 = in_XMM0_Qa;
    local_498 = in_XMM1_Qa;
    local_488 = in_XMM2_Qa;
    local_478 = in_XMM3_Qa;
    local_468 = in_XMM4_Qa;
    local_458 = in_XMM5_Qa;
    local_448 = in_XMM6_Qa;
    local_438 = in_XMM7_Qa;
  }
  local_4c8 = in_RDX;
  local_4c0 = in_RCX;
  local_4b8 = in_R8;
  local_4b0 = in_R9;
  sys_bashfilename(path,(char *)&imode);
  if ((oflag & 0x40U) == 0) {
    pathbuf._996_4_ = open((char *)&imode,oflag);
  }
  else {
    ap[0].overflow_arg_area = local_4d8;
    ap[0]._0_8_ = &stack0x00000008;
    local_424 = 0x30;
    local_428 = 0x18;
    ap[0].reg_save_area._0_4_ = (undefined4)local_4c8;
    ap[0].reg_save_area._4_4_ = ap[0].reg_save_area._0_4_;
    pathbuf._996_4_ = open((char *)&imode,oflag,local_4c8 & 0xffffffff);
  }
  iVar1._0_1_ = pathbuf[0x3e4];
  iVar1._1_1_ = pathbuf[0x3e5];
  iVar1._2_1_ = pathbuf[0x3e6];
  iVar1._3_1_ = pathbuf[999];
  return iVar1;
}

Assistant:

int sys_open(const char *path, int oflag, ...)
{
    int i, fd;
    char pathbuf[MAXPDSTRING];
    sys_bashfilename(path, pathbuf);
    if (oflag & O_CREAT)
    {
        mode_t mode;
        int imode;
        va_list ap;
        va_start(ap, oflag);

        /* Mac compiler complains if we just set mode = va_arg ... so, even
        though we all know it's just an int, we explicitly va_arg to an int
        and then convert.
           -> http://www.mail-archive.com/bug-gnulib@gnu.org/msg14212.html
           -> http://bugs.debian.org/647345
        */

        imode = va_arg (ap, int);
        mode = (mode_t)imode;
        va_end(ap);
        fd = open(pathbuf, oflag, mode);
    }
    else
        fd = open(pathbuf, oflag);
    return fd;
}